

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

uint64_t __thiscall kratos::IRNode::index_of(IRNode *this,IRNode *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t index;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    iVar1 = (*this->_vptr_IRNode[1])(this);
    if (CONCAT44(extraout_var,iVar1) <= uVar2) {
      return uVar2;
    }
    iVar1 = (*this->_vptr_IRNode[2])(this,uVar2);
    if ((IRNode *)CONCAT44(extraout_var_00,iVar1) == node) break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

uint64_t IRNode::index_of(const kratos::IRNode *node) {
    uint64_t index;
    for (index = 0; index < child_count(); index++) {
        auto *n = get_child(index);
        if (n == node) break;
    }
    return index;
}